

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_IncorrectConstructionOptionAsVector_Test::TestBody
          (TApp_IncorrectConstructionOptionAsVector_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  AssertHelper local_a8;
  Message local_a0 [2];
  IncorrectConstruction *anon_var_0;
  char *pcStack_88;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_78;
  allocator local_41;
  string local_40;
  Option *local_20;
  Option *cat;
  TApp_IncorrectConstructionOptionAsVector_Test *pTStack_10;
  int x;
  TApp_IncorrectConstructionOptionAsVector_Test *this_local;
  
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"--cat",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",(allocator *)((long)&gtest_msg.value + 7));
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_40,(int *)((long)&cat + 4),&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pOVar2;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff78,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff78);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      CLI::Option::expected(local_20,2);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_88 = 
    "Expected: cat->expected(2) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_a0);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x8f,pcStack_88);
  testing::internal::AssertHelper::operator=(&local_a8,local_a0);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  testing::Message::~Message(local_a0);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionOptionAsVector) {
    int x;
    auto cat = app.add_option("--cat", x);
    EXPECT_THROW(cat->expected(2), CLI::IncorrectConstruction);
}